

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

Texture * rw::Texture::streamReadNative(Stream *stream)

{
  FILE *__stream;
  bool bVar1;
  uint32 uVar2;
  Texture *pTVar3;
  char *pcVar4;
  Error _e;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    uVar2 = Stream::readU32(stream);
    (*stream->_vptr_Stream[5])(stream,0xfffffffffffffff0,1);
    switch(uVar2) {
    case 5:
      pTVar3 = xbox::readNativeTexture(stream);
      return pTVar3;
    case 6:
    case 7:
    case 10:
    case 0xb:
      break;
    case 8:
      pTVar3 = d3d8::readNativeTexture(stream);
      return pTVar3;
    case 9:
      pTVar3 = d3d9::readNativeTexture(stream);
      return pTVar3;
    case 0xc:
      pTVar3 = gl3::readNativeTexture(stream);
      return pTVar3;
    default:
      if (uVar2 == 0x325350) {
        pTVar3 = ps2::readNativeTexture(stream);
        return pTVar3;
      }
    }
  }
  else {
    _e.plugin = 0;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
            ,0x1d5);
    __stream = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
    fprintf(__stream,"%s\n",pcVar4);
    setError(&_e);
  }
  return (Texture *)0x0;
}

Assistant:

Texture*
Texture::streamReadNative(Stream *stream)
{
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	uint32 platform = stream->readU32();
	stream->seek(-16);
	if(platform == FOURCC_PS2)
		return ps2::readNativeTexture(stream);
	if(platform == PLATFORM_D3D8)
		return d3d8::readNativeTexture(stream);
	if(platform == PLATFORM_D3D9)
		return d3d9::readNativeTexture(stream);
	if(platform == PLATFORM_XBOX)
		return xbox::readNativeTexture(stream);
	if(platform == PLATFORM_GL3)
		return gl3::readNativeTexture(stream);
	assert(0 && "unsupported platform");
	return nil;
}